

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBackUTF8
          (UnicodeSetStringSpan *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  UBool UVar6;
  int length_00;
  UChar32 c;
  int32_t iVar7;
  UBool *pUVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  char cVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uint8_t *puVar23;
  int iVar24;
  uint8_t *puVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  int32_t local_bc;
  int local_94;
  UnicodeSet *local_90;
  uint8_t *local_88;
  UnicodeSetStringSpan *local_80;
  int32_t *local_78;
  OffsetList local_70;
  uint8_t *local_48;
  long local_40;
  uint8_t *local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar7 = spanNotBackUTF8(this,s,length);
    return iVar7;
  }
  local_90 = &this->spanSet;
  length_00 = UnicodeSet::spanBackUTF8(local_90,(char *)s,length,USET_SPAN_CONTAINED);
  if (length_00 == 0) {
    local_bc = 0;
  }
  else {
    local_70.list = local_70.staticList;
    local_70.capacity = 0;
    local_70.length = 0;
    local_70.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      iVar14 = this->maxLength8;
      iVar24 = 0x10;
      pUVar8 = local_70.list;
      if (((long)iVar14 < 0x11) ||
         (pUVar8 = (UBool *)uprv_malloc_63((long)iVar14), iVar24 = iVar14, pUVar8 != (UBool *)0x0))
      {
        local_70.list = pUVar8;
        local_70.capacity = iVar24;
      }
      memset(local_70.list,0,(long)local_70.capacity);
    }
    uVar18 = length - length_00;
    uVar5 = this->strings->count;
    lVar17 = 0;
    if (this->all != '\0') {
      lVar17 = (long)(int)uVar5 * 3;
    }
    local_48 = this->spanLengths + lVar17;
    local_80 = this;
    local_38 = s;
    do {
      pbVar9 = local_80->utf8;
      puVar25 = s;
      if (spanCondition == USET_SPAN_CONTAINED) {
        if (0 < (int)uVar5) {
          local_78 = (int32_t *)(ulong)(length_00 + 1U);
          local_88 = (uint8_t *)(long)(int)uVar18;
          uVar20 = 0;
          do {
            iVar14 = local_80->utf8Lengths[uVar20];
            lVar17 = (long)iVar14;
            if (lVar17 != 0) {
              bVar3 = local_48[uVar20];
              uVar22 = (uint)bVar3;
              if (bVar3 == 0xff) {
                pbVar9 = pbVar9 + lVar17;
                cVar15 = '\x06';
              }
              else {
                if (bVar3 == 0xfe) {
                  uVar22 = 0xffffffff;
                  if ((iVar14 != 1) && (bVar3 = *pbVar9, 0xcc < (byte)(bVar3 + 0xb))) {
                    bVar4 = pbVar9[1];
                    if ((bVar3 & 0xf0) == 0xe0) {
                      if ((((byte)" 000000000000\x1000"[bVar3 & 0xf] >> (bVar4 >> 5) & 1) != 0) &&
                         (uVar22 = 0xfffffffe, iVar14 != 2)) {
                        uVar22 = (-0x41 < (char)pbVar9[2]) - 3;
                      }
                    }
                    else if (bVar3 < 0xe0) {
                      uVar22 = ~(uint)((char)bVar4 < -0x40);
                    }
                    else if ((((((byte)""[bVar4 >> 4] >> (bVar3 & 7) & 1) != 0) &&
                              (uVar22 = 0xfffffffe, iVar14 != 2)) && ((char)pbVar9[2] < -0x40)) &&
                            (uVar22 = 0xfffffffd, iVar14 != 3)) {
                      uVar22 = (char)pbVar9[3] < -0x40 ^ 0xfffffffd;
                    }
                  }
                  uVar22 = uVar22 + iVar14;
                }
                uVar26 = uVar18;
                if ((int)uVar22 < (int)uVar18) {
                  uVar26 = uVar22;
                }
                if ((int)(iVar14 - uVar26) <= length_00) {
                  lVar13 = (long)(int)(iVar14 - uVar26);
                  uVar10 = uVar18;
                  if ((int)uVar22 < (int)uVar18) {
                    uVar10 = uVar22;
                  }
                  iVar24 = length_00 + 1U + uVar26;
                  puVar23 = (uint8_t *)(long)(int)uVar22;
                  if ((long)local_88 <= (long)(int)uVar22) {
                    puVar23 = local_88;
                  }
                  puVar23 = s + (long)(puVar23 + (length_00 - lVar17));
                  do {
                    if (-0x41 < (char)puVar25[length_00 - lVar13]) {
                      iVar11 = local_70.start + (int)lVar13;
                      iVar21 = local_70.capacity;
                      if (iVar11 < local_70.capacity) {
                        iVar21 = 0;
                      }
                      iVar11 = iVar11 - iVar21;
                      if (local_70.list[iVar11] == '\0') {
                        lVar16 = 0;
                        iVar21 = iVar14;
                        do {
                          pbVar1 = puVar23 + lVar16;
                          pbVar2 = pbVar9 + lVar16;
                          if (*pbVar1 != *pbVar2) break;
                          lVar16 = lVar16 + 1;
                          bVar27 = 1 < iVar21;
                          iVar21 = iVar21 + -1;
                        } while (bVar27);
                        puVar25 = local_38;
                        if (*pbVar1 == *pbVar2) {
                          if (length_00 == (int)lVar13) {
                            local_bc = 0;
                            cVar15 = '\x01';
                            goto LAB_001a8553;
                          }
                          local_70.list[iVar11] = '\x01';
                          local_70.length = local_70.length + 1;
                        }
                      }
                    }
                    bVar27 = uVar26 == 0;
                    uVar26 = uVar26 - 1;
                    if (bVar27) break;
                    lVar13 = lVar13 + 1;
                    puVar23 = puVar23 + -1;
                  } while (iVar24 - uVar10 != (int)lVar13);
                }
                pbVar9 = pbVar9 + lVar17;
                cVar15 = '\0';
              }
LAB_001a8553:
              if ((cVar15 != '\x06') && (cVar15 != '\0')) goto LAB_001a8806;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar5);
        }
LAB_001a86f9:
        if ((uVar18 == 0) && (length_00 != length)) {
          if (local_70.length == 0) {
            iVar7 = UnicodeSet::spanBackUTF8(local_90,(char *)puVar25,length_00,USET_SPAN_CONTAINED)
            ;
            uVar18 = length_00 - iVar7;
            cVar15 = (uVar18 != 0 && iVar7 != 0) * '\x02' + '\x01';
            length_00 = iVar7;
            if (uVar18 == 0 || iVar7 == 0) {
              local_bc = iVar7;
            }
          }
          else {
            bVar3 = puVar25[(long)length_00 + -1];
            if ((char)bVar3 < '\0') {
              local_94 = length_00 + -1;
              c = utf8_prevCharSafeBody_63(puVar25,0,&local_94,(uint)bVar3,-3);
              iVar14 = local_94;
              UVar6 = UnicodeSet::contains(local_90,c);
              uVar18 = -(length_00 - iVar14);
              if (UVar6 != '\0') {
                uVar18 = length_00 - iVar14;
              }
            }
            else {
              UVar6 = UnicodeSet::contains(local_90,(uint)bVar3);
              uVar18 = -(uint)(UVar6 == '\0') | 1;
            }
            if ((int)uVar18 < 1) goto LAB_001a87f1;
            iVar14 = length_00 - uVar18;
            if (iVar14 == 0) {
              local_bc = 0;
              cVar15 = '\x01';
            }
            else {
              iVar7 = local_70.capacity;
              if ((int)(uVar18 + local_70.start) < local_70.capacity) {
                iVar7 = 0;
              }
              local_70.start = (uVar18 + local_70.start) - iVar7;
              if (local_70.list[local_70.start] != '\0') {
                local_70.list[local_70.start] = '\0';
                local_70.length = local_70.length + -1;
              }
              cVar15 = '\x03';
              uVar18 = 0;
              length_00 = iVar14;
            }
          }
        }
        else if (local_70.length == 0) {
          cVar15 = '\x01';
          local_bc = length_00;
        }
        else {
LAB_001a87f1:
          iVar7 = OffsetList::popMinimum(&local_70);
          length_00 = length_00 - iVar7;
          uVar18 = 0;
          cVar15 = '\0';
        }
      }
      else {
        if ((int)uVar5 < 1) {
          bVar27 = true;
          iVar14 = 0;
        }
        else {
          local_78 = local_80->utf8Lengths;
          lVar17 = (long)length_00;
          local_88 = s + lVar17;
          local_40 = (long)(int)uVar18;
          uVar20 = 0;
          uVar22 = 0;
          iVar14 = 0;
          do {
            uVar26 = local_78[uVar20];
            lVar13 = (long)(int)uVar26;
            if (lVar13 != 0) {
              uVar10 = (uint)local_48[uVar20];
              if (0xfd < local_48[uVar20]) {
                uVar10 = uVar26;
              }
              uVar12 = uVar18;
              if ((int)uVar10 < (int)uVar18) {
                uVar12 = uVar10;
              }
              if (((int)(uVar26 - uVar12) <= length_00) && ((int)uVar22 <= (int)uVar12)) {
                lVar19 = (long)(int)(uVar26 - uVar12);
                lVar16 = (long)(int)uVar10;
                if (local_40 <= (int)uVar10) {
                  lVar16 = local_40;
                }
                puVar23 = local_88 + (lVar16 - lVar13);
                do {
                  if ((-0x41 < (char)s[lVar17 - lVar19]) &&
                     (((int)uVar22 < (int)uVar12 || (iVar14 < lVar19)))) {
                    lVar16 = 0;
                    uVar10 = uVar26;
                    do {
                      pbVar2 = puVar23 + lVar16;
                      pbVar1 = pbVar9 + lVar16;
                      if (*pbVar2 != *pbVar1) break;
                      lVar16 = lVar16 + 1;
                      bVar27 = 1 < (int)uVar10;
                      uVar10 = uVar10 - 1;
                    } while (bVar27);
                    if (*pbVar2 == *pbVar1) {
                      iVar14 = (int)lVar19;
                      uVar22 = uVar12;
                      break;
                    }
                  }
                  if (lVar17 <= lVar19) break;
                  lVar19 = lVar19 + 1;
                  puVar23 = puVar23 + -1;
                  bVar27 = (int)uVar22 < (int)uVar12;
                  uVar12 = uVar12 - 1;
                } while (bVar27);
              }
              pbVar9 = pbVar9 + lVar13;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar5);
          bVar27 = uVar22 == 0;
        }
        cVar15 = '\0';
        bVar27 = (bool)(iVar14 == 0 & bVar27);
        if (!bVar27) {
          length_00 = length_00 - iVar14;
          bVar28 = length_00 != 0;
          if (bVar28) {
            uVar18 = 0;
          }
          cVar15 = bVar28 * '\x02' + '\x01';
          if (!bVar28) {
            local_bc = 0;
          }
        }
        if (bVar27) goto LAB_001a86f9;
      }
LAB_001a8806:
      s = puVar25;
    } while ((cVar15 == '\0') || (cVar15 == '\x03'));
    OffsetList::~OffsetList(&local_70);
  }
  return local_bc;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBackUTF8(s, length);
    }
    int32_t pos=spanSet.spanBackUTF8((const char *)s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength8);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackUTF8Lengths=spanLengths;
    if(all) {
        spanBackUTF8Lengths+=3*stringsLength;
    }
    for(;;) {
        const uint8_t *s8=utf8;
        int32_t length8;
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    s8+=length8;
                    continue;  // Irrelevant string.
                }

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U8_FWD_1(s8, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        !offsets.containsOffset(dec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                length8=utf8Lengths[i];
                if(length8==0) {
                    continue;  // String not representable in UTF-8.
                }
                int32_t overlap=spanBackUTF8Lengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                // Try to match this string at pos-(length8-overlap)..pos-length8.
                if(overlap>=LONG_SPAN) {
                    overlap=length8;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length8-overlap;  // Keep dec+overlap==length8.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    // Match at code point boundaries. (The UTF-8 strings were converted
                    // from UTF-16 and are guaranteed to be well-formed.)
                    if( !U8_IS_TRAIL(s[pos-dec]) &&
                        (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches8(s+pos-dec, s8, length8)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
                s8+=length8;
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBackUTF8((const char *)s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBackUTF8(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}